

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

char * array_new<signed_char>(void *placement,size_t length)

{
  char *p;
  char *res;
  size_t length_local;
  void *placement_local;
  
  p = (char *)placement;
  length_local = length;
  while (length_local != 0) {
    *p = '\0';
    p = p + 1;
    length_local = length_local - 1;
  }
  return (char *)placement;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}